

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O1

int tnt_reload_schema(tnt_stream *s)

{
  anon_union_128_3_89b29c27_for_data *r_00;
  void *pvVar1;
  uint32_t reqid;
  int iVar2;
  long lVar3;
  char **i;
  anon_union_128_3_89b29c27_for_data *paVar4;
  tnt_reply *ptVar5;
  uint uVar6;
  tnt_reply *r;
  byte bVar7;
  undefined1 local_150 [8];
  tnt_reply bkp;
  tnt_iter it;
  
  bVar7 = 0;
  pvVar1 = s->data;
  i = (char **)0xffffffff;
  if ((*(int *)((long)pvVar1 + 0x78) != 0) && (s->wrcnt == 0)) {
    reqid = tnt_stream_reqid(s,0x7f);
    tnt_get_space(s);
    tnt_get_index(s);
    tnt_stream_reqid(s,reqid);
    tnt_io_flush((tnt_stream_net *)s->data);
    i = &bkp.sqlinfo_end;
    tnt_iter_reply((tnt_iter *)i,s);
    tnt_reply_init((tnt_reply *)local_150);
    uVar6 = 0;
    r_00 = &it.data;
    do {
      iVar2 = tnt_next((tnt_iter *)i);
      if (iVar2 == 0) {
        if (bkp.bitmap != 0) {
          tnt_schema_add_indexes(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)local_150);
          uVar6 = uVar6 + 2;
          tnt_reply_free((tnt_reply *)local_150);
        }
        i = (char **)0x0;
        if (uVar6 == 3) goto LAB_0010e5b4;
        goto LAB_0010e5af;
      }
      iVar2 = 5;
      if (it.data.map.value_end == (char *)0x80) {
        if (it.data.reply.r.schema_id == 0) {
          if ((uVar6 & 1) == 0) {
            paVar4 = r_00;
            ptVar5 = (tnt_reply *)local_150;
            for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
              *(char **)ptVar5 = (paVar4->array).data;
              paVar4 = (anon_union_128_3_89b29c27_for_data *)
                       ((long)paVar4 + (ulong)bVar7 * -0x10 + 8);
              ptVar5 = (tnt_reply *)((long)ptVar5 + (ulong)bVar7 * -0x10 + 8);
            }
            it.data.array.elem = (char *)0x0;
          }
          else {
            uVar6 = uVar6 + 2;
            tnt_schema_add_indexes(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)&r_00->array)
            ;
          }
          goto LAB_0010e569;
        }
      }
      else if ((it.data.map.value_end == (char *)0x7f) && (it.data.reply.r.schema_id == 0)) {
        tnt_schema_add_spaces(*(tnt_schema **)((long)pvVar1 + 0x100),(tnt_reply *)&r_00->array);
        uVar6 = uVar6 + 1;
LAB_0010e569:
        iVar2 = 0;
      }
    } while (iVar2 == 0);
    if (iVar2 == 5) {
LAB_0010e5af:
      i = (char **)0xffffffff;
LAB_0010e5b4:
      tnt_iter_free((tnt_iter *)&bkp.sqlinfo_end);
    }
  }
  return (int)i;
}

Assistant:

int tnt_reload_schema(struct tnt_stream *s)
{
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if (!sn->connected || pm_atomic_load(&s->wrcnt) != 0)
		return -1;
	uint64_t oldsync = tnt_stream_reqid(s, 127);
	tnt_get_space(s);
	tnt_get_index(s);
	tnt_stream_reqid(s, oldsync);
	tnt_flush(s);
	struct tnt_iter it; tnt_iter_reply(&it, s);
	struct tnt_reply bkp; tnt_reply_init(&bkp);
	int sloaded = 0;
	while (tnt_next(&it)) {
		struct tnt_reply *r = TNT_IREPLY_PTR(&it);
		switch (r->sync) {
		case(127):
			if (r->error)
				goto error;
			tnt_schema_add_spaces(sn->schema, r);
			sloaded += 1;
			break;
		case(128):
			if (r->error)
				goto error;
			if (!(sloaded & 1)) {
				memcpy(&bkp, r, sizeof(struct tnt_reply));
				r->buf = NULL;
				break;
			}
			sloaded += 2;
			tnt_schema_add_indexes(sn->schema, r);
			break;
		default:
			goto error;
		}
	}
	if (bkp.buf) {
		tnt_schema_add_indexes(sn->schema, &bkp);
		sloaded += 2;
		tnt_reply_free(&bkp);
	}
	if (sloaded != 3) goto error;

	tnt_iter_free(&it);
	return 0;
error:
	tnt_iter_free(&it);
	return -1;
}